

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
Catch::ExceptionTranslatorRegistry::tryTranslators_abi_cxx11_
          (string *__return_storage_ptr__,ExceptionTranslatorRegistry *this)

{
  undefined8 *__src;
  string *psVar1;
  pointer __src_00;
  size_type sVar2;
  size_type __n;
  pointer ppIVar3;
  size_t sVar4;
  void *__dest;
  
  ppIVar3 = (this->m_translators).
            super__Vector_base<const_Catch::IExceptionTranslator_*,_std::allocator<const_Catch::IExceptionTranslator_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppIVar3 !=
      (this->m_translators).
      super__Vector_base<const_Catch::IExceptionTranslator_*,_std::allocator<const_Catch::IExceptionTranslator_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    (*(*ppIVar3)->_vptr_IExceptionTranslator[2])(__return_storage_ptr__,*ppIVar3,ppIVar3 + 1);
    return __return_storage_ptr__;
  }
  __cxa_rethrow();
  __src = (undefined8 *)__return_storage_ptr__->_M_string_length;
  if (__src != (undefined8 *)(__return_storage_ptr__->field_2)._M_allocated_capacity) {
    psVar1 = (string *)(this->super_IExceptionTranslatorRegistry)._vptr_IExceptionTranslatorRegistry
    ;
    *__src = psVar1;
    __return_storage_ptr__->_M_string_length = __return_storage_ptr__->_M_string_length + 8;
    return psVar1;
  }
  __n = std::
        vector<const_Catch::IExceptionTranslator_*,_std::allocator<const_Catch::IExceptionTranslator_*>_>
        ::_M_check_len((vector<const_Catch::IExceptionTranslator_*,_std::allocator<const_Catch::IExceptionTranslator_*>_>
                        *)__return_storage_ptr__,1,"vector::_M_realloc_insert");
  __src_00 = (__return_storage_ptr__->_M_dataplus)._M_p;
  sVar2 = __return_storage_ptr__->_M_string_length;
  sVar4 = (long)__src - (long)__src_00;
  ppIVar3 = std::
            _Vector_base<const_Catch::IExceptionTranslator_*,_std::allocator<const_Catch::IExceptionTranslator_*>_>
            ::_M_allocate((_Vector_base<const_Catch::IExceptionTranslator_*,_std::allocator<const_Catch::IExceptionTranslator_*>_>
                           *)__return_storage_ptr__,__n);
  *(_func_int ***)((long)ppIVar3 + sVar4) =
       (this->super_IExceptionTranslatorRegistry)._vptr_IExceptionTranslatorRegistry;
  if (0 < (long)sVar4) {
    memmove(ppIVar3,__src_00,sVar4);
  }
  __dest = (void *)((long)ppIVar3 + sVar4 + 8);
  sVar4 = sVar2 - (long)__src;
  if (0 < (long)sVar4) {
    memmove(__dest,__src,sVar4);
  }
  if (__src_00 != (pointer)0x0) {
    operator_delete(__src_00);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)ppIVar3;
  __return_storage_ptr__->_M_string_length = (long)__dest + sVar4;
  (__return_storage_ptr__->field_2)._M_allocated_capacity = (size_type)(ppIVar3 + __n);
  return (string *)(ppIVar3 + __n);
}

Assistant:

Generic::AnyOf<ExpressionT> Matcher<ExpressionT>::operator || ( Matcher<ExpressionT> const& other ) const {
        Generic::AnyOf<ExpressionT> anyOfExpr;
        anyOfExpr.add( *this );
        anyOfExpr.add( other );
        return anyOfExpr;
    }